

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNErrCode SUNMatCopy_Sparse(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar1 = *(long *)(*(long *)((long)A->content + 0x38) + *(long *)((long)A->content + 0x18) * 8);
  if (*(long *)((long)B->content + 0x10) < lVar1) {
    pvVar4 = realloc(*(void **)((long)B->content + 0x30),lVar1 * 8);
    pvVar2 = B->content;
    *(void **)((long)pvVar2 + 0x30) = pvVar4;
    pvVar4 = realloc(*(void **)((long)pvVar2 + 0x20),lVar1 * 8);
    pvVar2 = B->content;
    *(void **)((long)pvVar2 + 0x20) = pvVar4;
    *(long *)((long)pvVar2 + 0x10) = lVar1;
  }
  SUNMatZero_Sparse(B);
  pvVar2 = A->content;
  pvVar4 = B->content;
  if (0 < lVar1) {
    lVar6 = *(long *)((long)pvVar2 + 0x20);
    lVar5 = *(long *)((long)pvVar2 + 0x30);
    lVar3 = *(long *)((long)pvVar4 + 0x20);
    lVar7 = *(long *)((long)pvVar4 + 0x30);
    lVar8 = 0;
    do {
      *(undefined8 *)(lVar3 + lVar8 * 8) = *(undefined8 *)(lVar6 + lVar8 * 8);
      *(undefined8 *)(lVar7 + lVar8 * 8) = *(undefined8 *)(lVar5 + lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (lVar1 != lVar8);
  }
  lVar6 = *(long *)((long)pvVar2 + 0x18);
  if (lVar6 < 1) {
    lVar5 = *(long *)((long)pvVar4 + 0x38);
  }
  else {
    lVar3 = *(long *)((long)pvVar2 + 0x38);
    lVar5 = *(long *)((long)pvVar4 + 0x38);
    lVar7 = 0;
    do {
      *(undefined8 *)(lVar5 + lVar7 * 8) = *(undefined8 *)(lVar3 + lVar7 * 8);
      lVar7 = lVar7 + 1;
      lVar6 = *(long *)((long)pvVar2 + 0x18);
    } while (lVar7 < lVar6);
  }
  *(long *)(lVar5 + lVar6 * 8) = lVar1;
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Sparse(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, A_nz;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation */
  A_nz = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];

  /* ensure that B is allocated with at least as
     much memory as we have nonzeros in A */
  if (SM_NNZ_S(B) < A_nz)
  {
    SM_INDEXVALS_S(B) = (sunindextype*)realloc(SM_INDEXVALS_S(B),
                                               A_nz * sizeof(sunindextype));
    SUNAssert(SM_INDEXVALS_S(B), SUN_ERR_MALLOC_FAIL);

    SM_DATA_S(B) = (sunrealtype*)realloc(SM_DATA_S(B),
                                         A_nz * sizeof(sunrealtype));
    SUNAssert(SM_DATA_S(B), SUN_ERR_MALLOC_FAIL);

    SM_NNZ_S(B) = A_nz;
  }

  /* zero out B so that copy works correctly */
  SUNCheckCall(SUNMatZero_Sparse(B));

  /* copy the data and row indices over */
  for (i = 0; i < A_nz; i++)
  {
    (SM_DATA_S(B))[i]      = (SM_DATA_S(A))[i];
    (SM_INDEXVALS_S(B))[i] = (SM_INDEXVALS_S(A))[i];
  }

  /* copy the column pointers over */
  for (i = 0; i < SM_NP_S(A); i++)
  {
    (SM_INDEXPTRS_S(B))[i] = (SM_INDEXPTRS_S(A))[i];
  }
  (SM_INDEXPTRS_S(B))[SM_NP_S(A)] = A_nz;

  return SUN_SUCCESS;
}